

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cow_guarded.hpp
# Opt level: O2

void __thiscall
gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter::operator()(deleter *this,int *ptr)

{
  cow_guarded<int,_std::timed_mutex> *this_00;
  __shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2> local_40;
  shared_ptr<const_int> newPtr;
  
  if (this->m_cancelled == true) {
    operator_delete(ptr,4);
  }
  else if (ptr != (int *)0x0) {
    std::__shared_ptr<int_const,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<int,void>
              ((__shared_ptr<int_const,(__gnu_cxx::_Lock_policy)2> *)
               &newPtr.super___shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>,ptr);
    this_00 = this->m_guarded;
    std::__shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,&newPtr.super___shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>);
    lr_guarded<std::shared_ptr<int_const>,std::mutex>::operator()
              ((lr_guarded<std::shared_ptr<int_const>,std::mutex> *)this_00,
               (anon_class_16_1_629f9e6c *)&local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&newPtr.super___shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  if ((this->m_lock)._M_owns == true) {
    std::unique_lock<std::timed_mutex>::unlock(&this->m_lock);
  }
  return;
}

Assistant:

void operator()(T* ptr)
        {
            if (m_cancelled) {
                delete ptr;
            } else if (ptr) {
                std::shared_ptr<const T> newPtr(ptr);

                m_guarded.m_data.modify(
                    [newPtr](std::shared_ptr<const T>& sptr) {
                        sptr = newPtr;
                    });
            }

            if (m_lock.owns_lock()) {
                m_lock.unlock();
            }
        }